

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

_Bool imap_is_bchar(char ch)

{
  _Bool local_9;
  char ch_local;
  
  if ((((ch < '0') || ('9' < ch)) && ((ch < 'a' || ('z' < ch)))) && ((ch < 'A' || ('Z' < ch)))) {
    switch(ch) {
    case '!':
    case '$':
    case '%':
    case '&':
    case '\'':
    case '(':
    case ')':
    case '*':
    case '+':
    case ',':
    case '-':
    case '.':
    case '/':
    case ':':
    case '=':
    case '@':
    case '_':
    case '~':
      local_9 = true;
      break;
    default:
      local_9 = false;
    }
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

static bool imap_is_bchar(char ch)
{
  /* Performing the alnum check with this macro is faster because of ASCII
     arithmetic */
  if(ISALNUM(ch))
    return TRUE;

  switch(ch) {
    /* bchar */
    case ':': case '@': case '/':
    /* bchar -> achar */
    case '&': case '=':
    /* bchar -> achar -> uchar -> unreserved (without alphanumeric) */
    case '-': case '.': case '_': case '~':
    /* bchar -> achar -> uchar -> sub-delims-sh */
    case '!': case '$': case '\'': case '(': case ')': case '*':
    case '+': case ',':
    /* bchar -> achar -> uchar -> pct-encoded */
    case '%': /* HEXDIG chars are already included above */
      return TRUE;

    default:
      return FALSE;
  }
}